

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketConnection.cpp
# Opt level: O3

void __thiscall
FIX::SocketConnection::SocketConnection
          (SocketConnection *this,socket_handle s,Sessions *sessions,SocketMonitor *pMonitor)

{
  __fd_mask *p_Var1;
  int iVar2;
  int iVar3;
  
  (this->super_Responder)._vptr_Responder = (_func_int **)&PTR__SocketConnection_001ec4d0;
  this->m_socket = s;
  (this->m_parser).m_buffer._M_dataplus._M_p = (pointer)&(this->m_parser).m_buffer.field_2;
  (this->m_parser).m_buffer._M_string_length = 0;
  (this->m_parser).m_buffer.field_2._M_local_buf[0] = '\0';
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->m_sendQueue).
  super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_initialize_map(&(this->m_sendQueue).
                       super__Deque_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ,0);
  this->m_sendLength = 0;
  std::
  _Rb_tree<FIX::SessionID,_FIX::SessionID,_std::_Identity<FIX::SessionID>,_std::less<FIX::SessionID>,_std::allocator<FIX::SessionID>_>
  ::_Rb_tree(&(this->m_sessions)._M_t,&sessions->_M_t);
  this->m_pSession = (Session *)0x0;
  this->m_pMonitor = pMonitor;
  (this->m_mutex).m_count = 0;
  (this->m_mutex).m_threadID = 0;
  pthread_mutex_init((pthread_mutex_t *)&this->m_mutex,(pthread_mutexattr_t *)0x0);
  (this->m_fds).fds_bits[0] = 0;
  (this->m_fds).fds_bits[1] = 0;
  (this->m_fds).fds_bits[2] = 0;
  (this->m_fds).fds_bits[3] = 0;
  (this->m_fds).fds_bits[4] = 0;
  (this->m_fds).fds_bits[5] = 0;
  (this->m_fds).fds_bits[6] = 0;
  (this->m_fds).fds_bits[7] = 0;
  (this->m_fds).fds_bits[8] = 0;
  (this->m_fds).fds_bits[9] = 0;
  (this->m_fds).fds_bits[10] = 0;
  (this->m_fds).fds_bits[0xb] = 0;
  (this->m_fds).fds_bits[0xc] = 0;
  (this->m_fds).fds_bits[0xd] = 0;
  (this->m_fds).fds_bits[0xe] = 0;
  (this->m_fds).fds_bits[0xf] = 0;
  iVar2 = this->m_socket;
  iVar3 = iVar2 + 0x3f;
  if (-1 < iVar2) {
    iVar3 = iVar2;
  }
  p_Var1 = (this->m_fds).fds_bits + (iVar3 >> 6);
  *p_Var1 = *p_Var1 | 1L << ((byte)iVar2 & 0x3f);
  return;
}

Assistant:

SocketConnection::SocketConnection(socket_handle s, Sessions sessions,
                                    SocketMonitor* pMonitor )
: m_socket( s ), m_sendLength( 0 ),
  m_sessions(sessions), m_pSession( 0 ), m_pMonitor( pMonitor )
{
  FD_ZERO( &m_fds );
  FD_SET( m_socket, &m_fds );
}